

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<4>::rehash(InnerLeaf<4> *this,int hashPos)

{
  uint8_t pos_00;
  uint16_t uVar1;
  reference this_00;
  uint64_t hash_00;
  reference pvVar2;
  int in_ESI;
  Occupation *in_RDI;
  type entry;
  uint64_t hash;
  int pos;
  uint8_t hashChunk;
  int i;
  int i_1;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_stack_ffffffffffffff88;
  HighsHashTableEntry<std::pair<int,_int>,_double> *__n;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_stack_ffffffffffffffa0;
  reference in_stack_ffffffffffffffa8;
  InnerLeaf<4> *in_stack_ffffffffffffffb0;
  int local_28;
  int local_20;
  int local_1c;
  Occupation local_18;
  int local_c;
  
  local_c = in_ESI;
  Occupation::Occupation(&local_18,0);
  in_RDI->occupation = local_18.occupation;
  for (local_1c = 0; local_1c < (int)in_RDI[1].occupation; local_1c = local_1c + 1) {
    this_00 = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                        ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                         in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
    HighsHashTableEntry<std::pair<int,_int>,_double>::key(this_00);
    hash_00 = compute_hash((pair<int,_int> *)0x73b5c2);
    uVar1 = get_hash_chunks16(hash_00,local_c);
    in_stack_ffffffffffffffb0 = (InnerLeaf<4> *)(ulong)uVar1;
    pvVar2 = std::array<unsigned_long,_55UL>::operator[]
                       ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff90,
                        (size_type)in_stack_ffffffffffffff88);
    *pvVar2 = (value_type_conflict6)in_stack_ffffffffffffffb0;
    pvVar2 = std::array<unsigned_long,_55UL>::operator[]
                       ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff90,
                        (size_type)in_stack_ffffffffffffff88);
    pos_00 = get_first_chunk16((uint16_t)*pvVar2);
    Occupation::set(in_RDI,pos_00);
  }
  local_20 = 0;
  while (local_20 < (int)in_RDI[1].occupation) {
    pvVar2 = std::array<unsigned_long,_55UL>::operator[]
                       ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff90,
                        (size_type)in_stack_ffffffffffffff88);
    get_first_chunk16((uint16_t)*pvVar2);
    local_28 = Occupation::num_set_until
                         ((Occupation *)in_stack_ffffffffffffff90,
                          (uint8_t)((ulong)in_stack_ffffffffffffff88 >> 0x38));
    local_28 = local_28 + -1;
    __n = in_stack_ffffffffffffff88;
    if (local_20 < local_28) {
      in_stack_ffffffffffffffa0 =
           (HighsHashTableEntry<std::pair<int,_int>,_double> *)
           std::array<unsigned_long,_55UL>::operator[]
                     ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff90,
                      (size_type)in_stack_ffffffffffffff88);
      pvVar2 = std::array<unsigned_long,_55UL>::operator[]
                         ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff90,
                          (size_type)in_stack_ffffffffffffff88);
      std::swap<unsigned_long>((unsigned_long *)in_stack_ffffffffffffffa0,pvVar2);
      in_stack_ffffffffffffffa8 =
           std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                     ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                      in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                 in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      std::swap<HighsHashTableEntry<std::pair<int,int>,double>>
                (in_stack_ffffffffffffffa0,
                 (HighsHashTableEntry<std::pair<int,_int>,_double> *)
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    }
    else {
      while( true ) {
        in_stack_ffffffffffffff9f = false;
        if (local_28 < local_20) {
          pvVar2 = std::array<unsigned_long,_55UL>::operator[]
                             ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff90,(size_type)__n
                             );
          in_stack_ffffffffffffff90 = (HighsHashTableEntry<std::pair<int,_int>,_double> *)*pvVar2;
          pvVar2 = std::array<unsigned_long,_55UL>::operator[]
                             ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff90,(size_type)__n
                             );
          in_stack_ffffffffffffff9f =
               (HighsHashTableEntry<std::pair<int,_int>,_double> *)*pvVar2 <=
               in_stack_ffffffffffffff90;
        }
        if ((bool)in_stack_ffffffffffffff9f == false) break;
        local_28 = local_28 + 1;
      }
      in_stack_ffffffffffffff88 = __n;
      if (local_28 < local_20) {
        pvVar2 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff90,(size_type)__n);
        in_stack_ffffffffffffff88 = (HighsHashTableEntry<std::pair<int,_int>,_double> *)*pvVar2;
        std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                  ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                   in_stack_ffffffffffffff90,(size_type)__n);
        move_backward(in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffa8,
                      (int *)in_stack_ffffffffffffffa0);
        pvVar2 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff90,
                            (size_type)in_stack_ffffffffffffff88);
        *pvVar2 = (value_type_conflict6)in_stack_ffffffffffffff88;
        std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL>::operator[]
                  ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                   in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
        HighsHashTableEntry<std::pair<int,_int>,_double>::operator=
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }